

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O0

void __thiscall
logging_tests::logging_LogPrintMacros::~logging_LogPrintMacros(logging_LogPrintMacros *this)

{
  long lVar1;
  long in_FS_OFFSET;
  LogSetup *in_stack_00000078;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LogSetup::~LogSetup(in_stack_00000078);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacros, LogSetup)
{
    LogTrace(BCLog::NET, "foo6: %s\n", "bar6"); // not logged
    LogDebug(BCLog::NET, "foo7: %s\n", "bar7");
    LogInfo("foo8: %s\n", "bar8");
    LogWarning("foo9: %s\n", "bar9");
    LogError("foo10: %s\n", "bar10");
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    std::vector<std::string> expected = {
        "[net] foo7: bar7",
        "foo8: bar8",
        "[warning] foo9: bar9",
        "[error] foo10: bar10",
    };
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}